

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O2

int divideby(int M,int d)

{
  int iVar1;
  
  do {
    iVar1 = M;
    M = iVar1 / d;
  } while (iVar1 % d == 0);
  return (uint)(iVar1 == 1);
}

Assistant:

int divideby(int M,int d) {
	while (M%d == 0) {
		M = M/d;
	}
	if (M == 1) {
		return 1;
	}
	 return 0;
}